

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O0

size_t __thiscall
linq::
IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>
::Count(IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>
        *this)

{
  bool bVar1;
  int local_cc;
  int *local_c8;
  int *_;
  undefined1 local_80 [8];
  iterator __end0;
  iterator __begin0;
  IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>
  *__range2;
  size_t count;
  IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>
  *this_local;
  
  __range2 = (IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>
              *)0x0;
  begin((iterator *)&__end0.valid,this);
  end((iterator *)local_80,this);
  while( true ) {
    iterator::iterator((iterator *)&_,(iterator *)local_80);
    bVar1 = iterator::operator!=((iterator *)&__end0.valid,(iterator *)&_);
    iterator::~iterator((iterator *)&_);
    if (!bVar1) break;
    local_cc = iterator::operator*((iterator *)&__end0.valid);
    local_c8 = &local_cc;
    __range2 = (IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>
                *)((long)&(__range2->source).super_IState<int>._vptr_IState + 1);
    iterator::operator++((iterator *)&__end0.valid);
  }
  iterator::~iterator((iterator *)local_80);
  iterator::~iterator((iterator *)&__end0.valid);
  return (size_t)__range2;
}

Assistant:

size_t Count() 
		{
			size_t count = 0; 
			
			for(const auto& _ : *this) 
				count++; 
			
			return count;
		}